

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::DrawXFBStream::prepareObjects(DrawXFBStream *this)

{
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  undefined4 *puVar7;
  uint local_1c;
  GLuint i;
  Functions *gl;
  DrawXFBStream *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  pTVar5 = deqp::Context::getTestContext(this->m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  GVar2 = Utilities::buildProgram
                    (gl_00,pTVar6,s_geometry_shader,(GLchar *)0x0,(GLchar *)0x0,
                     s_vertex_shader_blank,s_fragment_shader,s_xfb_varyings,3,0x8c8c,false,
                     (GLint *)0x0);
  this->m_program_id_generate = GVar2;
  if (this->m_program_id_generate == 0) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  pTVar5 = deqp::Context::getTestContext(this->m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  GVar2 = Utilities::buildProgram
                    (gl_00,pTVar6,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,s_vertex_shader_pass,
                     s_fragment_shader,(GLchar **)0x0,0,0x8c8c,false,(GLint *)0x0);
  this->m_program_id_draw = GVar2;
  if (this->m_program_id_draw == 0) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (*gl_00->genTransformFeedbacks)(1,&this->m_xfb_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenTransformFeedbacks call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x155e);
  (*gl_00->bindTransformFeedback)(0x8e22,this->m_xfb_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindTransformFeedbacks call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1561);
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1565);
  (*gl_00->bindVertexArray)(this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1568);
  (*gl_00->genBuffers)(2,this->m_bo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x156c);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    (*gl_00->bindBuffer)(0x8c8e,this->m_bo_id[local_1c]);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1571);
    (*gl_00->bufferData)(0x8c8e,0x30,(void *)0x0,0x88ea);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1574);
    (*gl_00->bindBufferBase)(0x8c8e,local_1c,this->m_bo_id[local_1c]);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBindBufferRange call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1577);
  }
  (*gl_00->genQueries)(4,this->m_qo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenQueries call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x157c);
  (*gl_00->clearColor)(0.0,0.0,0.0,1.0);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glClearColor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1580);
  (*gl_00->genFramebuffers)(1,&this->m_fbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1583);
  (*gl_00->genRenderbuffers)(1,&this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1586);
  (*gl_00->bindFramebuffer)(0x8d40,this->m_fbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1589);
  (*gl_00->bindRenderbuffer)(0x8d41,this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x158c);
  (*gl_00->renderbufferStorage)(0x8d41,0x8229,2,2);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glRenderbufferStorage call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x158f);
  (*gl_00->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,this->m_rbo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glFramebufferRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1592);
  GVar3 = (*gl_00->checkFramebufferStatus)(0x8d40);
  if (GVar3 != 0x8cd5) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (*gl_00->viewport)(0,0,2,2);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x159a);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBStream::prepareObjects()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare programs. */
	m_program_id_generate = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), s_geometry_shader, NULL, NULL, s_vertex_shader_blank,
		s_fragment_shader, s_xfb_varyings, s_xfb_varyings_count, GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id_generate)
	{
		throw 0;
	}

	m_program_id_draw = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_pass, s_fragment_shader, NULL, 0,
		GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id_draw)
	{
		throw 0;
	}

	/* Prepare transform feedbacks. */
	gl.genTransformFeedbacks(1, &m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedbacks call failed.");

	/* Create empty Vertex Array Object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Prepare buffer objects. */
	gl.genBuffers(s_bo_ids_count, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	for (glw::GLuint i = 0; i < s_bo_ids_count; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_size, NULL, GL_DYNAMIC_COPY); /* allocation */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, i, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange call failed.");
	}

	/* Generate queries */
	gl.genQueries(s_qo_ids_count, m_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");

	/* Prepare framebuffer. */
	gl.clearColor(0.f, 0.f, 0.f, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor call failed.");

	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.genRenderbuffers(1, &m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer call failed.");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_R8, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage call failed.");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");
}